

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void fill_MPP_FMT_BGR555(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (R >> 3 & 0x1f) + (G & 0xf8) * 4;
  uVar1 = (B & 0xf8) << 7 | uVar2;
  if (be == 0) {
    *p = (RK_U8)uVar2;
    uVar2 = uVar1 >> 8;
  }
  else {
    *p = (RK_U8)(uVar1 >> 8);
  }
  p[1] = (RK_U8)uVar2;
  return;
}

Assistant:

static void fill_MPP_FMT_BGR555(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_BGR555 = ffmpeg: bgr555be
    // 16 bit pixel     MSB  -------->  LSB
    //                 (0bbb,bbgg,gggr,rrrr)
    // big    endian   |  byte 0 |  byte 1 |
    // little endian   |  byte 1 |  byte 0 |
    RK_U16 val = (((R >> 3) & 0x1f) <<  0) |
                 (((G >> 3) & 0x1f) <<  5) |
                 (((B >> 3) & 0x1f) << 10);
    if (be) {
        p[0] = (val >> 8) & 0xff;
        p[1] = (val >> 0) & 0xff;
    } else {
        p[0] = (val >> 0) & 0xff;
        p[1] = (val >> 8) & 0xff;
    }
}